

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.c
# Opt level: O0

int64_t sysbvm_time_nanosecondsTimestamp(void)

{
  undefined1 local_18 [8];
  timespec ts;
  
  memset(local_18,0,0x10);
  clock_gettime(1,(timespec *)local_18);
  return (long)local_18 * 1000000000 + ts.tv_sec;
}

Assistant:

SYSBVM_API int64_t sysbvm_time_nanosecondsTimestamp(void)
{
#ifdef _WIN32
    LARGE_INTEGER timestamp = {0};
    LARGE_INTEGER timestampFrequency = {0};
    if(!QueryPerformanceCounter(&timestamp) || !QueryPerformanceFrequency(&timestampFrequency))
        return 0;

    int64_t frequencyDivisor = timestampFrequency.QuadPart / (int64_t)1000000000;
    return timestamp.QuadPart / frequencyDivisor;
#else
    struct timespec ts = {};
    clock_gettime(CLOCK_MONOTONIC, &ts);
    return (int64_t)ts.tv_sec * (int64_t)1000000000 + (int64_t)ts.tv_nsec; 
#endif
}